

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv6address.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPIPv6Address::IsSameAddress(RTPIPv6Address *this,RTPAddress *addr)

{
  AddressType AVar1;
  int local_34;
  int i;
  uint8_t *ip2;
  RTPIPv6Address *addr2;
  RTPAddress *addr_local;
  RTPIPv6Address *this_local;
  
  if (addr == (RTPAddress *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv6Address) {
      if (this->port == *(uint16_t *)&addr[1].field_0xc) {
        for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
          if ((&(this->super_RTPAddress).field_0xc)[local_34] != (&addr->field_0xc)[local_34]) {
            return false;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTPIPv6Address::IsSameAddress(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != RTPAddress::IPv6Address)
		return false;

	const RTPIPv6Address *addr2 = (const RTPIPv6Address *)addr;
	const uint8_t *ip2 = addr2->ip.s6_addr;
	
	if (port != addr2->port)
		return false;
	
	for (int i = 0 ; i < 16 ; i++)
	{
		if (ip.s6_addr[i] != ip2[i])
			return false;
	}
	return true;
}